

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-sw.c
# Opt level: O0

void sha256_sw_block(uint32_t *core,uint8_t *block)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint round_index;
  ulong local_160;
  size_t t_2;
  size_t t_1;
  size_t t;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t w [64];
  uint8_t *block_local;
  uint32_t *core_local;
  
  for (t_1 = 0; t_1 < 0x10; t_1 = t_1 + 1) {
    uVar1 = GET_32BIT_MSB_FIRST(block + t_1 * 4);
    (&b)[t_1] = uVar1;
  }
  for (t_2 = 0x10; t_2 < 0x40; t_2 = t_2 + 1) {
    uVar2 = sigma_1((&b)[t_2 - 2]);
    uVar1 = (&b)[t_2 - 7];
    uVar3 = sigma_0((&b)[t_2 - 0xf]);
    (&b)[t_2] = uVar2 + uVar1 + uVar3 + (&b)[t_2 - 0x10];
  }
  c = *core;
  d = core[1];
  e = core[2];
  f = core[3];
  g = core[4];
  h = core[5];
  t._4_4_ = core[6];
  t._0_4_ = core[7];
  for (local_160 = 0; local_160 < 0x40; local_160 = local_160 + 8) {
    round_index = (uint)local_160;
    sha256_sw_round(round_index,&b,&c,&d,&e,&f,&g,&h,(uint32_t *)((long)&t + 4),(uint32_t *)&t);
    sha256_sw_round(round_index + 1,&b,(uint32_t *)&t,&c,&d,&e,&f,&g,&h,(uint32_t *)((long)&t + 4));
    sha256_sw_round(round_index + 2,&b,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,&d,&e,&f,&g,&h);
    sha256_sw_round(round_index + 3,&b,&h,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,&d,&e,&f,&g);
    sha256_sw_round(round_index + 4,&b,&g,&h,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,&d,&e,&f);
    sha256_sw_round(round_index + 5,&b,&f,&g,&h,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,&d,&e);
    sha256_sw_round(round_index + 6,&b,&e,&f,&g,&h,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c,&d);
    sha256_sw_round(round_index + 7,&b,&d,&e,&f,&g,&h,(uint32_t *)((long)&t + 4),(uint32_t *)&t,&c);
  }
  *core = c + *core;
  core[1] = d + core[1];
  core[2] = e + core[2];
  core[3] = f + core[3];
  core[4] = g + core[4];
  core[5] = h + core[5];
  core[6] = t._4_4_ + core[6];
  core[7] = (uint32_t)t + core[7];
  smemclr(&b,0x100);
  return;
}

Assistant:

static void sha256_sw_block(uint32_t *core, const uint8_t *block)
{
    uint32_t w[SHA256_ROUNDS];
    uint32_t a,b,c,d,e,f,g,h;

    for (size_t t = 0; t < 16; t++)
        w[t] = GET_32BIT_MSB_FIRST(block + 4*t);

    for (size_t t = 16; t < SHA256_ROUNDS; t++)
        w[t] = sigma_1(w[t-2]) + w[t-7] + sigma_0(w[t-15]) + w[t-16];

    a = core[0]; b = core[1]; c = core[2]; d = core[3];
    e = core[4]; f = core[5]; g = core[6]; h = core[7];

    for (size_t t = 0; t < SHA256_ROUNDS; t += 8) {
        sha256_sw_round(t+0, w, &a,&b,&c,&d,&e,&f,&g,&h);
        sha256_sw_round(t+1, w, &h,&a,&b,&c,&d,&e,&f,&g);
        sha256_sw_round(t+2, w, &g,&h,&a,&b,&c,&d,&e,&f);
        sha256_sw_round(t+3, w, &f,&g,&h,&a,&b,&c,&d,&e);
        sha256_sw_round(t+4, w, &e,&f,&g,&h,&a,&b,&c,&d);
        sha256_sw_round(t+5, w, &d,&e,&f,&g,&h,&a,&b,&c);
        sha256_sw_round(t+6, w, &c,&d,&e,&f,&g,&h,&a,&b);
        sha256_sw_round(t+7, w, &b,&c,&d,&e,&f,&g,&h,&a);
    }

    core[0] += a; core[1] += b; core[2] += c; core[3] += d;
    core[4] += e; core[5] += f; core[6] += g; core[7] += h;

    smemclr(w, sizeof(w));
}